

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdUtils.c
# Opt level: O1

int CmdCommandDispatch(Abc_Frame_t *pAbc,int *pargc,char ***pargv)

{
  char **argv;
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pNtkNew;
  char *pcVar3;
  char **ppcVar4;
  double dVar5;
  Abc_Command *pCommand;
  char *value;
  char *local_48;
  double local_40;
  char *local_38;
  
  iVar2 = *pargc;
  if (iVar2 == 0) {
    return 0;
  }
  argv = *pargv;
  iVar1 = cmdCheckShellEscape(pAbc,iVar2,argv);
  if (iVar1 == 0) {
    iVar1 = st__lookup(pAbc->tCommands,*argv,&local_48);
    ppcVar4 = argv;
    if (iVar1 == 0) {
      if ((iVar2 != 1) || (pcVar3 = strchr(*argv,0x2e), pcVar3 == (char *)0x0)) {
        fprintf((FILE *)pAbc->Err,"** cmd error: unknown command \'%s\'\n",*argv);
        fwrite("(this is likely caused by using an alias defined in \"abc.rc\"\n",0x3d,1,
               (FILE *)pAbc->Err);
        fwrite("without having this file in the current or parent directory)\n",0x3d,1,
               (FILE *)pAbc->Err);
        return 1;
      }
      ppcVar4 = CmdAddToArgv(1,argv);
      CmdFreeArgv(1,argv);
      *pargc = 2;
      *pargv = ppcVar4;
      iVar2 = st__lookup(pAbc->tCommands,*ppcVar4,&local_48);
      if (iVar2 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdUtils.c"
                      ,0x7e,"int CmdCommandDispatch(Abc_Frame_t *, int *, char ***)");
      }
      iVar2 = 2;
    }
    if (((*(int *)(local_48 + 0x18) != 0) && (pAbc->pNtkCur != (Abc_Ntk_t *)0x0)) &&
       (iVar1 = Abc_FrameIsFlagEnabled("backup"), iVar1 != 0)) {
      pNtkNew = Abc_NtkDup(pAbc->pNtkCur);
      Abc_FrameSetCurrentNetwork(pAbc,pNtkNew);
      Abc_FrameSwapCurrentAndBackup(pAbc);
    }
    local_40 = Extra_CpuTimeDouble();
    iVar2 = (**(code **)(local_48 + 0x10))(pAbc,iVar2,ppcVar4);
    dVar5 = Extra_CpuTimeDouble();
    pAbc->TimeCommand = (dVar5 - local_40) + pAbc->TimeCommand;
    if (iVar2 == 0) {
      if (pAbc->fAutoexac == 0) {
        iVar1 = st__lookup(pAbc->tFlags,"autoexec",&local_38);
        iVar2 = 0;
        if (iVar1 != 0) {
          pAbc->fAutoexac = 1;
          iVar2 = Cmd_CommandExecute(pAbc,local_38);
          pAbc->fAutoexac = 0;
        }
      }
      else {
        iVar2 = 0;
      }
    }
    return iVar2;
  }
  return 0;
}

Assistant:

int CmdCommandDispatch( Abc_Frame_t * pAbc, int * pargc, char *** pargv )
{
    int argc = *pargc;
    char ** argv = *pargv;
    char ** argv2;

    Abc_Ntk_t * pNetCopy;
    int (*pFunc) ( Abc_Frame_t *, int, char ** );
    Abc_Command * pCommand;
    char * value;
    int fError;
    double clk;

    if ( argc == 0 )
        return 0;

    if ( cmdCheckShellEscape( pAbc, argc, argv ) == 1 )
        return 0;

    // get the command
    if ( ! st__lookup( pAbc->tCommands, argv[0], (char **)&pCommand ) )
    {   // the command is not in the table
        // if there is only one word with an extension, assume this is file to be read
        if ( argc == 1 && strstr( argv[0], "." ) )
        {
            // add command 'read' assuming that this is the file name
            argv2 = CmdAddToArgv( argc, argv );
            CmdFreeArgv( argc, argv );
            argc = argc+1;
            argv = argv2;
            *pargc = argc;
            *pargv = argv;
            if ( ! st__lookup( pAbc->tCommands, argv[0], (char **)&pCommand ) )
                assert( 0 );
        }
        else
        {
            fprintf( pAbc->Err, "** cmd error: unknown command '%s'\n", argv[0] );
            fprintf( pAbc->Err, "(this is likely caused by using an alias defined in \"abc.rc\"\n" );
            fprintf( pAbc->Err, "without having this file in the current or parent directory)\n" );
            return 1;
        }
    }

    // get the backup network if the command is going to change the network
    if ( pCommand->fChange ) 
    {
        if ( pAbc->pNtkCur && Abc_FrameIsFlagEnabled( "backup" ) )
        {
            pNetCopy = Abc_NtkDup( pAbc->pNtkCur );
            Abc_FrameSetCurrentNetwork( pAbc, pNetCopy );
            // swap the current network and the backup network 
            // to prevent the effect of resetting the short names
            Abc_FrameSwapCurrentAndBackup( pAbc );
        }
    }

    // execute the command
    clk = Extra_CpuTimeDouble();
    pFunc = (int (*)(Abc_Frame_t *, int, char **))pCommand->pFunc;
    fError = (*pFunc)( pAbc, argc, argv );
    pAbc->TimeCommand += Extra_CpuTimeDouble() - clk;

    // automatic execution of arbitrary command after each command 
    // usually this is a passive command ... 
    if ( fError == 0 && !pAbc->fAutoexac )
    {
        if ( st__lookup( pAbc->tFlags, "autoexec", &value ) )
        {
            pAbc->fAutoexac = 1;
            fError = Cmd_CommandExecute( pAbc, value );
            pAbc->fAutoexac = 0;
        }
    }
    return fError;
}